

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCoro.hpp
# Opt level: O1

Result SCoro::Impl::
       poll_fn<2ul,SCoro::SCoro<Initial,RecordTime,WaitForExpiry,PrintPollAttempts,RecordTime>>
                 (SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime> *self)

{
  uint *puVar1;
  long lVar2;
  
  puVar1 = &(self->super_type).
            super_RecordTime<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_PrintPollAttempts,_WaitForExpiry,_RecordTime,_Initial>_>
            .
            super_StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_PrintPollAttempts,_WaitForExpiry,_RecordTime,_Initial>
            .
            super_PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_WaitForExpiry,_RecordTime,_Initial>_>
            .
            super_StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_WaitForExpiry,_RecordTime,_Initial>
            .
            super_WaitForExpiry<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_RecordTime,_Initial>_>
            .retries;
  *puVar1 = *puVar1 + 1;
  lVar2 = std::chrono::_V2::system_clock::now();
  return (Result)((*(long *)&(self->super_type).
                             super_RecordTime<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_PrintPollAttempts,_WaitForExpiry,_RecordTime,_Initial>_>
                             .
                             super_StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_PrintPollAttempts,_WaitForExpiry,_RecordTime,_Initial>
                             .
                             super_PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_WaitForExpiry,_RecordTime,_Initial>_>
                             .
                             super_StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_WaitForExpiry,_RecordTime,_Initial>
                             .
                             super_WaitForExpiry<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_RecordTime,_Initial>_>
                             .
                             super_StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_RecordTime,_Initial>
                  < lVar2 - (((time_point *)
                             ((long)&(self->super_type).
                                     super_RecordTime<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_PrintPollAttempts,_WaitForExpiry,_RecordTime,_Initial>_>
                                     .
                                     super_StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_PrintPollAttempts,_WaitForExpiry,_RecordTime,_Initial>
                                     .
                                     super_PrintPollAttempts<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_WaitForExpiry,_RecordTime,_Initial>_>
                                     .
                                     super_StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_WaitForExpiry,_RecordTime,_Initial>
                                     .
                                     super_WaitForExpiry<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_RecordTime,_Initial>_>
                                     .
                                     super_StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_RecordTime,_Initial>
                             + 8))->__d).__r) + Yield);
}

Assistant:

constexpr static Result poll_fn(Stgs & self) noexcept
        {
            return self.get_at(Index<index>{}).Poll();
        }